

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDwaCompressorSimd.cpp
# Opt level: O2

void anon_unknown.dwarf_111f50::dumpBuffer(SimdAlignedBuffer64f *buffer)

{
  ostream *poVar1;
  int j;
  long lVar2;
  long lVar3;
  int i;
  long lVar4;
  
  lVar3 = 0;
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
      poVar1 = (ostream *)
               std::ostream::operator<<
                         (&std::cout,*(float *)((long)buffer->_buffer + lVar2 * 4 + lVar3));
      std::operator<<(poVar1,"  ");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    lVar3 = lVar3 + 0x20;
  }
  return;
}

Assistant:

void
dumpBuffer (const SimdAlignedBuffer64f& buffer)
{
    for (int i = 0; i < 8; ++i)
    {
        for (int j = 0; j < 8; ++j)
        {
            cout << buffer._buffer[i * 8 + j] << "  ";
        }
        cout << endl;
    }
}